

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

int snprintf_canframe(char *buf,size_t size,cu_t *cu,int sep)

{
  __u8 _Var1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  if (size == 0) {
    size = 0;
    goto LAB_00101e31;
  }
  _Var1 = (cu->cc).__pad;
  bVar2 = (cu->fd).len;
  if ((char)bVar2 < '\0') {
    uVar3 = (cu->xl).len;
    uVar5 = (ulong)uVar3;
    uVar6 = (uint)uVar3;
    if (sep == 0) {
      uVar6 = 0;
    }
    if (size - 1 < (ulong)(uVar6 + (uint)uVar3 * 2 + 0x16)) goto LAB_00101c25;
    uVar6 = sprintf(buf,"%02X%03X#%02X:%02X:%08X#",(ulong)((cu->cc).can_id >> 0x10 & 0xff));
    if (uVar5 == 0) {
      uVar7 = (ulong)uVar6;
    }
    else {
      uVar8 = 0;
      do {
        lVar9 = (long)(int)uVar6;
        bVar2 = cu->field3[uVar8 + 0xc];
        buf[lVar9] = "0123456789ABCDEF"[bVar2 >> 4];
        buf[lVar9 + 1] = "0123456789ABCDEF"[bVar2 & 0xf];
        uVar7 = lVar9 + 2;
        uVar8 = uVar8 + 1;
        if (uVar8 < uVar5 && sep != 0) {
          buf[uVar7] = '.';
          uVar7 = (ulong)(uVar6 + 3);
        }
        uVar6 = (uint)uVar7;
      } while (uVar5 != uVar8);
    }
LAB_00101e2a:
    uVar5 = (long)(int)uVar7;
    size = uVar7;
  }
  else {
    uVar6 = 0x40;
    if (_Var1 == '\0') {
      uVar6 = 8;
    }
    uVar5 = (ulong)uVar6;
    if (bVar2 <= (byte)uVar6) {
      uVar5 = (ulong)bVar2;
    }
    iVar4 = (int)uVar5;
    iVar12 = iVar4;
    if (sep == 0) {
      iVar12 = 0;
    }
    uVar6 = (cu->cc).can_id;
    if (size - 1 < (ulong)((uVar6 >> 0x1d & 2) + iVar12 + iVar4 * 2 + 0xc)) {
LAB_00101c25:
      memset(buf,0x2d,size - 1);
      buf[size - 1] = '\0';
      goto LAB_00101e31;
    }
    if ((uVar6 >> 0x1d & 1) == 0) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 & 0x1fffffff;
        lVar9 = 8;
        do {
          buf[lVar9 + -1] = "0123456789ABCDEF"[uVar6 & 0xf];
          uVar6 = uVar6 >> 4;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        goto LAB_00101d39;
      }
      uVar6 = uVar6 & 0x7ff;
      lVar9 = 3;
      lVar11 = 3;
      do {
        buf[lVar11 + -1] = "0123456789ABCDEF"[uVar6 & 0xf];
        uVar6 = uVar6 >> 4;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar7 = 4;
    }
    else {
      uVar6 = uVar6 & 0x3fffffff;
      lVar9 = 8;
      do {
        buf[lVar9 + -1] = "0123456789ABCDEF"[uVar6 & 0xf];
        uVar6 = uVar6 >> 4;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
LAB_00101d39:
      lVar9 = 8;
      uVar7 = 9;
    }
    buf[lVar9] = '#';
    iVar12 = (int)uVar7;
    if (_Var1 != '\0') {
      buf[uVar7] = '#';
      buf[uVar7 + 1] = "0123456789ABCDEF"[(cu->cc).__pad & 0xf];
      uVar7 = uVar7 | 2;
      if (bVar2 == 0 || sep == 0) goto LAB_00101d97;
      buf[uVar7] = '.';
      uVar8 = (ulong)(iVar12 + 3);
LAB_00101d9c:
      uVar10 = 0;
      do {
        lVar9 = (long)(int)uVar8;
        bVar2 = cu->field3[uVar10 + 8];
        uVar7 = lVar9 + 2;
        uVar10 = uVar10 + 1;
        buf[lVar9] = "0123456789ABCDEF"[bVar2 >> 4];
        buf[lVar9 + 1] = "0123456789ABCDEF"[bVar2 & 0xf];
        if ((sep != 0) && (uVar10 < uVar5)) {
          buf[uVar7] = '.';
          uVar7 = (ulong)((int)uVar8 + 3);
        }
        uVar8 = uVar7 & 0xffffffff;
      } while (iVar4 + (uint)(iVar4 == 0) != uVar10);
LAB_00101dfb:
      if (((_Var1 == '\0') && ((char)uVar5 == '\b')) &&
         (bVar2 = (cu->cc).len8_dlc, (byte)(bVar2 - 9) < 7)) {
        iVar12 = (int)uVar7;
        buf[iVar12] = '_';
        uVar7 = (ulong)(iVar12 + 2);
        buf[(long)iVar12 + 1] = "0123456789ABCDEF"[bVar2];
      }
      goto LAB_00101e2a;
    }
    if ((cu->field3[3] & 0x40) == 0) {
LAB_00101d97:
      uVar8 = uVar7;
      if (bVar2 != 0) goto LAB_00101d9c;
      goto LAB_00101dfb;
    }
    uVar5 = uVar7 + 1;
    buf[uVar7] = 'R';
    size = uVar5;
    if (bVar2 != 0) {
      size = uVar7 | 2;
      buf[uVar5] = "0123456789ABCDEF"[(cu->fd).len & 0xf];
      uVar5 = size;
      if ((7 < bVar2) && ((byte)((cu->cc).len8_dlc - 9) < 7)) {
        buf[size] = '_';
        buf[uVar7 + 3] = "0123456789ABCDEF"[(cu->cc).len8_dlc & 0xf];
        uVar5 = (ulong)(iVar12 + 4);
        size = uVar5;
      }
    }
  }
  buf[uVar5] = '\0';
LAB_00101e31:
  return (int)size;
}

Assistant:

int snprintf_canframe(char *buf, size_t size, cu_t *cu, int sep)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, offset;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof("00123#11:22:12345678#") + 2 * len + (sep ? len : 0) > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		/* print prio and CAN XL header content */
		offset = sprintf(buf, "%02X%03X#%02X:%02X:%08X#",
				 (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				 (canid_t)(cu->xl.prio & CANXL_PRIO_MASK),
				 cu->xl.flags, cu->xl.sdt, cu->xl.af);

		/* data */
		for (i = 0; i < len; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (sep && (i + 1 < len))
				buf[offset++] = '.';
		}

		buf[offset] = 0;

		return offset;
	}

	/* handle CAN CC/FD frames - ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	if (sizeof("12345678#_F") + 2 * len + (sep ? len : 0) +	\
	    (cu->fd.can_id & CAN_RTR_FLAG ? 2 : 0) > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	if (cu->fd.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->fd.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		buf[8] = '#';
		offset = 9;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		buf[8] = '#';
		offset = 9;
	} else {
		put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
		buf[3] = '#';
		offset = 4;
	}

	/* CAN CC frames may have RTR enabled. There are no ERR frames with RTR */
	if (!is_canfd && cu->fd.can_id & CAN_RTR_FLAG) {
		buf[offset++] = 'R';
		/* print a given CAN 2.0B DLC if it's not zero */
		if (len && len <= CAN_MAX_DLEN) {
			buf[offset++] = hex_asc_upper_lo(cu->fd.len);

			/* check for optional raw DLC value for CAN 2.0B frames */
			if (len == CAN_MAX_DLEN) {
				if ((cu->cc.len8_dlc > CAN_MAX_DLEN) && (cu->cc.len8_dlc <= CAN_MAX_RAW_DLC)) {
					buf[offset++] = CC_DLC_DELIM;
					buf[offset++] = hex_asc_upper_lo(cu->cc.len8_dlc);
				}
			}
		}

		buf[offset] = 0;
		return offset;
	}

	/* any CAN FD flags */
	if (is_canfd) {
		/* add CAN FD specific escape char and flags */
		buf[offset++] = '#';
		buf[offset++] = hex_asc_upper_lo(cu->fd.flags);
		if (sep && len)
			buf[offset++] = '.';
	}

	/* data */
	for (i = 0; i < len; i++) {
		put_hex_byte(buf + offset, cu->fd.data[i]);
		offset += 2;
		if (sep && (i + 1 < len))
			buf[offset++] = '.';
	}

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if (!is_canfd && (len == CAN_MAX_DLEN)) {
		unsigned char dlc = cu->cc.len8_dlc;

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC)) {
			buf[offset++] = CC_DLC_DELIM;
			buf[offset++] = hex_asc_upper_lo(dlc);
		}
	}

	buf[offset] = 0;

	return offset;
}